

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-cmdline.c
# Opt level: O2

void test_no_options(void)

{
  int iVar1;
  undefined8 in_RAX;
  
  iVar1 = cmdline_read(test_no_options::optlist,1,test_no_options::argv,test_no_options_callback,
                       (void *)0x0);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-cmdline.c"
                 ,0xab,"%s","ret == 0",in_RAX);
  return;
}

Assistant:

static void
test_no_options(void)
{
    static const CMDLINE_OPTION optlist[] = { { 0 } };
    static char* argv[] = { "foo" };
    static const int argc = sizeof(argv) / sizeof(argv[0]);
    int ret;

    ret = cmdline_read(optlist, argc, argv, test_no_options_callback, NULL);
    TEST_CHECK(ret == 0);
}